

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O2

void async_simple::coro::syncAwait<async_simple::coro::Lazy<void>>(Lazy<void> *lazy)

{
  long *plVar1;
  byte bVar2;
  Try<void> value;
  Condition cond;
  exception_ptr local_28;
  counting_semaphore<1L> local_1c;
  type local_18;
  
  plVar1 = *(long **)((long)(lazy->super_LazyBase<void,_false>)._coro.__handle_ + 0x18);
  if (plVar1 != (long *)0x0) {
    bVar2 = (**(code **)(*plVar1 + 0x18))();
    logicAssert((bool)(bVar2 ^ 1),"do not sync await in the same executor with Lazy");
  }
  local_18.cond = (Condition *)&local_1c;
  local_1c._M_sem._M_counter = (__semaphore_impl)0;
  local_28._M_exception_object = (void *)0x0;
  local_18.value = (Try<void> *)&local_28;
  detail::LazyBase<void,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            (&lazy->super_LazyBase<void,_false>,&local_18);
  std::counting_semaphore<1L>::acquire(&local_1c);
  Try<void>::value((Try<void> *)&local_28);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_28);
  return;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}